

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClusterList.h
# Opt level: O0

void __thiscall
SegmentClusterList<unsigned_int,_Memory::JitArenaAllocator,_16U>::Consolidate
          (SegmentClusterList<unsigned_int,_Memory::JitArenaAllocator,_16U> *this)

{
  uint uVar1;
  uint local_18;
  uint local_14;
  uint j;
  uint i;
  SegmentClusterList<unsigned_int,_Memory::JitArenaAllocator,_16U> *this_local;
  
  for (local_14 = 0; local_14 < this->maxIndex >> 4; local_14 = local_14 + 1) {
    if (this->backingStore[local_14] != (uint *)0x0) {
      for (local_18 = 0; local_18 < 0x10; local_18 = local_18 + 1) {
        uVar1 = SegmentClusterList<unsigned_int,Memory::JitArenaAllocator,16u>::Lookup<false,true>
                          ((SegmentClusterList<unsigned_int,Memory::JitArenaAllocator,16u> *)this,
                           this->backingStore[local_14][local_18]);
        this->backingStore[local_14][local_18] = uVar1;
      }
    }
  }
  this->consolidated = true;
  return;
}

Assistant:

void Consolidate()
    {
        for (indexType i = 0; i < maxIndex / numPerSegment; i++)
        {
            if (backingStore[i] != nullptr)
            {
                for (indexType j = 0; j < numPerSegment; j++)
                {
                    // We can assumeConsolidated here because everything less than the current index is consolidated
                    backingStore[i][j] = Lookup<false, true>(backingStore[i][j]);
                }
            }
        }
#if DBG
        consolidated = true;
#endif
    }